

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void highbd_blend_a64_d16_mask_subw1_subh1_w16_avx2
               (uint16_t *dst,int dst_stride,CONV_BUF_TYPE *src0,int src0_stride,CONV_BUF_TYPE *src1
               ,int src1_stride,uint8_t *mask,int mask_stride,int h,int w,__m256i *round_offset,
               int shift,__m256i *clip_low,__m256i *clip_high,__m256i *mask_max)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int in_ECX;
  long in_RDX;
  void *in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  long in_stack_00000008;
  undefined4 in_stack_0000002c;
  __m256i mask0a;
  __m256i m23;
  __m256i m01;
  __m256i m23_8;
  __m256i m01_8;
  __m256i m3;
  __m256i m2;
  __m256i m1;
  __m256i m0;
  int j;
  int i;
  __m256i two_w;
  __m256i one_b;
  undefined4 in_stack_fffffffffffffb1c;
  undefined5 in_stack_fffffffffffffb38;
  undefined1 uVar7;
  undefined2 uVar8;
  __m256i local_4c0;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  int local_368;
  int local_364;
  undefined1 local_360 [32];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  int local_314;
  long local_310;
  int local_304;
  long local_300;
  uint local_2f4;
  long local_2f0;
  undefined2 local_2e4;
  undefined1 local_2e1;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined4 local_1c4;
  undefined1 local_1c0 [32];
  undefined4 local_184;
  undefined1 local_180 [32];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [16];
  undefined1 auStack_d0 [16];
  undefined1 local_c0;
  undefined1 local_bf;
  undefined1 local_be;
  undefined1 local_bd;
  undefined1 local_bc;
  undefined1 local_bb;
  undefined1 local_ba;
  undefined1 local_b9;
  undefined1 local_b8;
  undefined1 local_b7;
  undefined1 local_b6;
  undefined1 local_b5;
  int src1_stride_00;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  int src0_stride_00;
  undefined1 auVar17 [32];
  
  local_2f4 = (uint)in_RSI;
  local_2e1 = 1;
  uVar7 = 1;
  src0_stride_00 = 0x1010101;
  uVar16 = 1;
  uVar15 = 1;
  uVar14 = 1;
  uVar13 = 1;
  uVar12 = 1;
  uVar11 = 1;
  uVar10 = 1;
  uVar9 = 1;
  src1_stride_00 = 0x1010101;
  local_b5 = 1;
  local_b6 = 1;
  local_b7 = 1;
  local_b8 = 1;
  local_b9 = 1;
  local_ba = 1;
  local_bb = 1;
  local_bc = 1;
  local_bd = 1;
  local_be = 1;
  local_bf = 1;
  local_c0 = 1;
  auVar1 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar1 = vpinsrb_avx(auVar1,1,2);
  auVar1 = vpinsrb_avx(auVar1,1,3);
  auVar1 = vpinsrb_avx(auVar1,1,4);
  auVar1 = vpinsrb_avx(auVar1,1,5);
  auVar1 = vpinsrb_avx(auVar1,1,6);
  auVar1 = vpinsrb_avx(auVar1,1,7);
  auVar1 = vpinsrb_avx(auVar1,1,8);
  auVar1 = vpinsrb_avx(auVar1,1,9);
  auVar1 = vpinsrb_avx(auVar1,1,10);
  auVar1 = vpinsrb_avx(auVar1,1,0xb);
  auVar1 = vpinsrb_avx(auVar1,1,0xc);
  auVar1 = vpinsrb_avx(auVar1,1,0xd);
  auVar1 = vpinsrb_avx(auVar1,1,0xe);
  local_e0 = vpinsrb_avx(auVar1,1,0xf);
  auVar1 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar1 = vpinsrb_avx(auVar1,1,2);
  auVar1 = vpinsrb_avx(auVar1,1,3);
  auVar1 = vpinsrb_avx(auVar1,1,4);
  auVar1 = vpinsrb_avx(auVar1,1,5);
  auVar1 = vpinsrb_avx(auVar1,1,6);
  auVar1 = vpinsrb_avx(auVar1,1,7);
  auVar1 = vpinsrb_avx(auVar1,1,8);
  auVar1 = vpinsrb_avx(auVar1,1,9);
  auVar1 = vpinsrb_avx(auVar1,1,10);
  auVar1 = vpinsrb_avx(auVar1,1,0xb);
  auVar1 = vpinsrb_avx(auVar1,1,0xc);
  auVar1 = vpinsrb_avx(auVar1,1,0xd);
  auVar1 = vpinsrb_avx(auVar1,1,0xe);
  auStack_d0 = vpinsrb_avx(auVar1,1,0xf);
  local_340 = local_e0._0_8_;
  uStack_338 = local_e0._8_8_;
  uStack_330 = auStack_d0._0_8_;
  uStack_328 = auStack_d0._8_8_;
  local_2e4 = 2;
  uVar8 = 2;
  auVar1 = vpinsrw_avx(ZEXT216(2),2,1);
  auVar1 = vpinsrw_avx(auVar1,2,2);
  auVar1 = vpinsrw_avx(auVar1,2,3);
  auVar1 = vpinsrw_avx(auVar1,2,4);
  auVar1 = vpinsrw_avx(auVar1,2,5);
  auVar1 = vpinsrw_avx(auVar1,2,6);
  auVar1 = vpinsrw_avx(auVar1,2,7);
  auVar2 = vpinsrw_avx(ZEXT216(2),2,1);
  auVar2 = vpinsrw_avx(auVar2,2,2);
  auVar2 = vpinsrw_avx(auVar2,2,3);
  auVar2 = vpinsrw_avx(auVar2,2,4);
  auVar2 = vpinsrw_avx(auVar2,2,5);
  auVar2 = vpinsrw_avx(auVar2,2,6);
  auVar2 = vpinsrw_avx(auVar2,2,7);
  local_360._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  local_360._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  auVar6 = ZEXT3264(local_360);
  local_314 = in_R9D;
  local_310 = in_R8;
  local_304 = in_ECX;
  local_300 = in_RDX;
  local_2f0 = in_RDI;
  auVar17 = local_360;
  for (local_364 = 0; local_364 < mask_stride; local_364 = local_364 + 2) {
    for (local_368 = 0; auVar5 = auVar6._0_32_, local_368 < h; local_368 = local_368 + 0x10) {
      yy_loadu_256((__m256i *)(in_stack_00000008 + (local_368 << 1)),in_RSI);
      local_3a0 = auVar5;
      yy_loadu_256((__m256i *)(in_stack_00000008 + (int)mask + (long)(local_368 << 1)),in_RSI);
      local_3c0 = auVar5;
      yy_loadu_256((__m256i *)(in_stack_00000008 + ((int)mask << 1) + (long)(local_368 << 1)),in_RSI
                  );
      local_3e0 = auVar5;
      yy_loadu_256((__m256i *)(in_stack_00000008 + (int)mask * 3 + (long)(local_368 << 1)),in_RSI);
      local_280 = local_3a0._0_8_;
      uStack_278 = local_3a0._8_8_;
      uStack_270 = local_3a0._16_8_;
      uStack_268 = local_3a0._24_8_;
      local_2a0 = local_3c0._0_8_;
      uStack_298 = local_3c0._8_8_;
      uStack_290 = local_3c0._16_8_;
      uStack_288 = local_3c0._24_8_;
      local_420 = vpaddusb_avx2(local_3a0,local_3c0);
      local_400._0_8_ = auVar5._0_8_;
      local_400._8_8_ = auVar5._8_8_;
      local_400._16_8_ = auVar5._16_8_;
      local_400._24_8_ = auVar5._24_8_;
      local_2c0 = local_3e0._0_8_;
      uStack_2b8 = local_3e0._8_8_;
      uStack_2b0 = local_3e0._16_8_;
      uStack_2a8 = local_3e0._24_8_;
      local_2e0 = local_400._0_8_;
      uStack_2d8 = local_400._8_8_;
      uStack_2d0 = local_400._16_8_;
      uStack_2c8 = local_400._24_8_;
      local_440 = vpaddusb_avx2(local_3e0,auVar5);
      local_200 = local_420._0_8_;
      uStack_1f8 = local_420._8_8_;
      uStack_1f0 = local_420._16_8_;
      uStack_1e8 = local_420._24_8_;
      local_220 = local_340;
      uStack_218 = uStack_338;
      uStack_210 = uStack_330;
      uStack_208 = uStack_328;
      auVar4._8_8_ = uStack_338;
      auVar4._0_8_ = local_340;
      auVar4._16_8_ = uStack_330;
      auVar4._24_8_ = uStack_328;
      local_460 = vpmaddubsw_avx2(local_420,auVar4);
      local_240 = local_440._0_8_;
      uStack_238 = local_440._8_8_;
      uStack_230 = local_440._16_8_;
      uStack_228 = local_440._24_8_;
      local_260 = local_340;
      uStack_258 = uStack_338;
      uStack_250 = uStack_330;
      uStack_248 = uStack_328;
      auVar3._8_8_ = uStack_338;
      auVar3._0_8_ = local_340;
      auVar3._16_8_ = uStack_330;
      auVar3._24_8_ = uStack_328;
      local_480 = vpmaddubsw_avx2(local_440,auVar3);
      local_100 = local_460._0_8_;
      uStack_f8 = local_460._8_8_;
      uStack_f0 = local_460._16_8_;
      uStack_e8 = local_460._24_8_;
      local_120 = local_360._0_8_;
      uStack_118 = local_360._8_8_;
      uStack_110 = local_360._16_8_;
      uStack_108 = local_360._24_8_;
      local_180 = vpaddw_avx2(local_460,local_360);
      local_184 = 2;
      local_4a0 = vpsrlw_avx2(local_180,ZEXT416(2));
      local_140 = local_480._0_8_;
      uStack_138 = local_480._8_8_;
      uStack_130 = local_480._16_8_;
      uStack_128 = local_480._24_8_;
      local_160 = local_360._0_8_;
      uStack_158 = local_360._8_8_;
      uStack_150 = local_360._16_8_;
      uStack_148 = local_360._24_8_;
      local_1c0 = vpaddw_avx2(local_480,local_360);
      local_1c4 = 2;
      local_4c0 = (__m256i)vpsrlw_avx2(local_1c0,ZEXT416(2));
      in_RSI = (void *)(ulong)local_2f4;
      auVar6 = ZEXT1664(local_4c0._0_16_);
      local_400 = auVar5;
      highbd_blend_a64_d16_mask_w16_avx2
                (auVar17._16_8_,auVar17._12_4_,auVar17._0_8_,src0_stride_00,
                 (CONV_BUF_TYPE *)
                 CONCAT17(uVar16,CONCAT16(uVar15,CONCAT15(uVar14,CONCAT14(uVar13,CONCAT13(uVar12,
                                                  CONCAT12(uVar11,CONCAT11(uVar10,uVar9))))))),
                 src1_stride_00,&local_4c0,(__m256i *)CONCAT44(in_stack_0000002c,w),
                 (__m256i *)CONCAT44(in_stack_fffffffffffffb1c,round_offset._0_4_),shift,clip_low,
                 clip_high,(__m256i *)CONCAT26(uVar8,CONCAT15(uVar7,in_stack_fffffffffffffb38)));
    }
    local_2f0 = local_2f0 + (long)(int)(local_2f4 << 1) * 2;
    local_300 = local_300 + (long)(local_304 << 1) * 2;
    local_310 = local_310 + (long)(local_314 << 1) * 2;
    in_stack_00000008 = in_stack_00000008 + ((int)mask << 2);
  }
  return;
}

Assistant:

static inline void highbd_blend_a64_d16_mask_subw1_subh1_w16_avx2(
    uint16_t *dst, int dst_stride, const CONV_BUF_TYPE *src0, int src0_stride,
    const CONV_BUF_TYPE *src1, int src1_stride, const uint8_t *mask,
    int mask_stride, int h, int w, const __m256i *round_offset, int shift,
    const __m256i *clip_low, const __m256i *clip_high,
    const __m256i *mask_max) {
  const __m256i one_b = _mm256_set1_epi8(1);
  const __m256i two_w = _mm256_set1_epi16(2);
  for (int i = 0; i < h; i += 2) {
    for (int j = 0; j < w; j += 16) {
      // Load 32x u8 alpha-mask values from each of four rows
      // (saturating) add pairs of rows, then use madd to add adjacent values
      // Finally, divide down each result with rounding
      const __m256i m0 = yy_loadu_256(mask + 0 * mask_stride + 2 * j);
      const __m256i m1 = yy_loadu_256(mask + 1 * mask_stride + 2 * j);
      const __m256i m2 = yy_loadu_256(mask + 2 * mask_stride + 2 * j);
      const __m256i m3 = yy_loadu_256(mask + 3 * mask_stride + 2 * j);

      const __m256i m01_8 = _mm256_adds_epu8(m0, m1);
      const __m256i m23_8 = _mm256_adds_epu8(m2, m3);

      const __m256i m01 = _mm256_maddubs_epi16(m01_8, one_b);
      const __m256i m23 = _mm256_maddubs_epi16(m23_8, one_b);

      const __m256i mask0a = _mm256_srli_epi16(_mm256_add_epi16(m01, two_w), 2);
      const __m256i mask0b = _mm256_srli_epi16(_mm256_add_epi16(m23, two_w), 2);

      highbd_blend_a64_d16_mask_w16_avx2(
          dst + j, dst_stride, src0 + j, src0_stride, src1 + j, src1_stride,
          &mask0a, &mask0b, round_offset, shift, clip_low, clip_high, mask_max);
    }
    dst += dst_stride * 2;
    src0 += src0_stride * 2;
    src1 += src1_stride * 2;
    mask += mask_stride * 4;
  }
}